

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O1

Status leveldb::WriteBatchInternal::InsertInto(WriteBatch *b,MemTable *memtable)

{
  long lVar1;
  uint8_t *buffer;
  long in_FS_OFFSET;
  MemTableInserter inserter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteBatch::Iterate(b,(Handler *)memtable);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)b;
  }
  __stack_chk_fail();
}

Assistant:

Status WriteBatchInternal::InsertInto(const WriteBatch* b, MemTable* memtable) {
  MemTableInserter inserter;
  inserter.sequence_ = WriteBatchInternal::Sequence(b);
  inserter.mem_ = memtable;
  return b->Iterate(&inserter);
}